

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O2

void __thiscall
avro::parsing::SimpleParser<avro::parsing::DummyHandler>::assertSize
          (SimpleParser<avro::parsing::DummyHandler> *this,size_t n)

{
  size_t sVar1;
  ostream *poVar2;
  Exception *this_00;
  string sStack_1b8;
  ostringstream oss;
  
  sVar1 = popSize(this);
  if (sVar1 == n) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Incorrect size. Expected: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," found ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  Exception::Exception(this_00,&sStack_1b8);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void assertSize(size_t n) {
        size_t s = popSize();
        if (s != n) {
            std::ostringstream oss;
            oss << "Incorrect size. Expected: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }